

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::drawDocument(QHexView *this,QTextCursor *c)

{
  QHexDocument *pQVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  QPalette *pQVar8;
  QColor *pQVar9;
  quint64 qVar10;
  ulong uVar11;
  qint64 qVar12;
  qsizetype qVar13;
  long lVar14;
  QHexView *pQVar15;
  sockaddr *__addr;
  sockaddr *__addr_00;
  QTextBlockFormat local_2e8 [16];
  QBrush local_2d8 [8];
  QBrush local_2d0 [8];
  QTextBlockFormat local_2c8 [8];
  QTextBlockFormat bf;
  undefined1 local_2b8 [20];
  QChar local_2a4;
  byte local_2a1;
  undefined1 local_2a0 [7];
  quint8 b_1;
  QString s_1;
  QTextCharFormat local_280 [4];
  uint column_1;
  QString local_270;
  QString local_258;
  undefined1 local_240 [48];
  QString local_210;
  byte local_1f3;
  byte local_1f2;
  byte local_1f1;
  QByteArray local_1f0;
  QByteArray local_1d8;
  QByteArray local_1c0;
  QString local_1a8;
  byte local_189;
  undefined1 local_188 [7];
  quint8 b;
  QString s;
  QTextCharFormat local_168 [4];
  uint byteidx;
  QTextCharFormat cf;
  undefined1 local_154 [8];
  uint column;
  QString local_140;
  undefined1 local_128 [8];
  QByteArray linebytes;
  QString local_f8;
  QBrush local_e0 [8];
  QBrush local_d8 [8];
  QBrush local_d0 [8];
  QBrush local_c8 [8];
  QTextCharFormat local_c0 [8];
  QTextCharFormat acf;
  QChar local_aa;
  QString local_a8;
  QString local_90;
  undefined1 local_78 [8];
  QString addrstr;
  quint64 address;
  qint64 l;
  QBrush local_40 [8];
  QTextCharFormat local_38 [8];
  QTextCharFormat addrformat;
  ulong local_28;
  quint64 line;
  qreal y;
  QTextCursor *c_local;
  QHexView *this_local;
  
  if (this->m_hexdocument != (QHexDocument *)0x0) {
    bVar3 = QHexOptions::hasFlag(&this->m_options,0x20);
    if (!bVar3) {
      lineHeight(this);
    }
    QAbstractScrollArea::verticalScrollBar();
    iVar6 = QAbstractSlider::value();
    local_28 = (ulong)iVar6;
    QTextCharFormat::QTextCharFormat(local_38);
    pQVar8 = (QPalette *)QWidget::palette();
    pQVar9 = QPalette::color(pQVar8,Active,Highlight);
    QBrush::QBrush(local_40,(QColor *)pQVar9,SolidPattern);
    QTextFormat::setForeground((QTextFormat *)local_38,local_40);
    QBrush::~QBrush(local_40);
    address = 0;
    while( true ) {
      bVar4 = QHexDocument::isEmpty(this->m_hexdocument);
      bVar3 = true;
      if (!bVar4) {
        qVar10 = lines(this);
        bVar3 = false;
        if (local_28 < qVar10) {
          iVar6 = visibleLines(this,false);
          bVar3 = (long)address < (long)iVar6;
        }
      }
      if (!bVar3) break;
      uVar7 = (this->m_options).linelength;
      qVar10 = baseAddress(this);
      addrstr.d.size = local_28 * uVar7 + qVar10;
      QString::number((ulonglong)&local_a8,(int)addrstr.d.size);
      uVar7 = addressWidth(this);
      QChar::QChar(&local_aa,'0');
      QString::rightJustified((longlong)&local_90,(QChar)(char16_t)&local_a8,SUB41(uVar7,0));
      QString::toUpper((QString *)local_78,&local_90);
      QString::~QString(&local_90);
      QString::~QString(&local_a8);
      QTextCharFormat::QTextCharFormat(local_c0);
      QBrush::QBrush(local_c8,(QColor *)&(this->m_options).headercolor,SolidPattern);
      QTextFormat::setForeground((QTextFormat *)local_c0,local_c8);
      QBrush::~QBrush(local_c8);
      bVar3 = QHexOptions::hasFlag(&this->m_options,0x10);
      if (bVar3) {
        pQVar8 = (QPalette *)QWidget::palette();
        pQVar9 = QPalette::color(pQVar8,Window);
        QBrush::QBrush(local_d0,(QColor *)pQVar9,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)local_c0,local_d0);
        QBrush::~QBrush(local_d0);
      }
      if (this->m_hexdelegate != (QHexDelegate *)0x0) {
        (**(code **)(*(long *)this->m_hexdelegate + 0x78))
                  (this->m_hexdelegate,addrstr.d.size,local_c0);
      }
      uVar11 = QHexCursor::line(this->m_hexcursor);
      if ((uVar11 == local_28) && (bVar3 = QHexOptions::hasFlag(&this->m_options,0x40), bVar3)) {
        pQVar8 = (QPalette *)QWidget::palette();
        pQVar9 = QPalette::color(pQVar8,Highlight);
        QBrush::QBrush(local_d8,(QColor *)pQVar9,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)local_c0,local_d8);
        QBrush::~QBrush(local_d8);
        pQVar8 = (QPalette *)QWidget::palette();
        pQVar9 = QPalette::color(pQVar8,HighlightedText);
        QBrush::QBrush(local_e0,(QColor *)pQVar9,SolidPattern);
        QTextFormat::setForeground((QTextFormat *)local_c0,local_e0);
        QBrush::~QBrush(local_e0);
      }
      ::operator+((QString *)&linebytes.d.size," ",(QString *)local_78);
      ::operator+(&local_f8,(QString *)&linebytes.d.size," ");
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&local_f8);
      QString::~QString(&local_f8);
      QString::~QString((QString *)&linebytes.d.size);
      getLine((QByteArray *)local_128,this,local_28);
      QString::QString(&local_140," ");
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_154 + 4));
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&local_140);
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)(local_154 + 4));
      QString::~QString(&local_140);
      local_154._0_4_ = 0;
      while ((uint)local_154._0_4_ < (this->m_options).linelength) {
        QTextCharFormat::QTextCharFormat(local_168);
        for (s.d.size._4_4_ = 0; s.d.size._4_4_ < (this->m_options).grouplength;
            s.d.size._4_4_ = s.d.size._4_4_ + 1) {
          pQVar15 = this;
          QString::QString((QString *)local_188);
          local_189 = 0;
          pQVar1 = this->m_hexdocument;
          qVar12 = positionFromLineCol(this,local_28,(ulong)(uint)local_154._0_4_);
          uVar7 = QHexDocument::accept(pQVar1,(int)qVar12,__addr,(socklen_t *)pQVar15);
          if ((uVar7 & 1) == 0) {
            local_240._22_2_ = (this->m_options).invalidchar.ucs;
            QString::QString((QString *)(local_240 + 0x18),(QChar)local_240._22_2_);
            QString::repeated((longlong)&local_210);
            QString::operator=((QString *)local_188,&local_210);
            QString::~QString(&local_210);
            QString::~QString((QString *)(local_240 + 0x18));
          }
          else {
            local_1f1 = 0;
            local_1f2 = 0;
            local_1f3 = 0;
            bVar3 = QByteArray::isEmpty((QByteArray *)local_128);
            if ((bVar3) ||
               (qVar13 = QByteArray::size((QByteArray *)local_128),
               qVar13 <= (long)(ulong)(uint)local_154._0_4_)) {
              QString::QString(&local_1a8,"  ");
            }
            else {
              QByteArray::mid((longlong)&local_1f0,(longlong)local_128);
              local_1f1 = 1;
              QHexUtils::toHex(&local_1d8,&local_1f0);
              local_1f2 = 1;
              QByteArray::toUpper(&local_1c0,&local_1d8);
              local_1f3 = 1;
              QString::QString(&local_1a8,&local_1c0);
            }
            QString::operator=((QString *)local_188,&local_1a8);
            QString::~QString(&local_1a8);
            if ((local_1f3 & 1) != 0) {
              QByteArray::~QByteArray(&local_1c0);
            }
            if ((local_1f2 & 1) != 0) {
              QByteArray::~QByteArray(&local_1d8);
            }
            if ((local_1f1 & 1) != 0) {
              QByteArray::~QByteArray(&local_1f0);
            }
            qVar13 = QByteArray::size((QByteArray *)local_128);
            if ((int)local_154._0_4_ < qVar13) {
              local_189 = QByteArray::at((QByteArray *)local_128,(ulong)(uint)local_154._0_4_);
            }
            else {
              local_189 = 0;
            }
          }
          bVar2 = local_189;
          QByteArray::size((QByteArray *)local_128);
          drawFormat((QHexView *)local_240,(QTextCursor *)this,(quint8)c,(QString *)(ulong)bVar2,
                     (QHexArea)local_188,2,local_28,SUB41(local_154._0_4_,0));
          QTextCharFormat::operator=(local_168,(QTextCharFormat *)local_240);
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)local_240);
          QString::~QString((QString *)local_188);
          local_154._0_4_ = local_154._0_4_ + 1;
        }
        QString::QString(&local_258," ");
        QTextCursor::insertText((QString *)c,(QTextCharFormat *)&local_258);
        QString::~QString(&local_258);
        QTextCharFormat::~QTextCharFormat(local_168);
      }
      QString::QString(&local_270," ");
      QTextCharFormat::QTextCharFormat(local_280);
      QTextCursor::insertText((QString *)c,(QTextCharFormat *)&local_270);
      QTextCharFormat::~QTextCharFormat(local_280);
      QString::~QString(&local_270);
      for (s_1.d.size._4_4_ = 0; s_1.d.size._4_4_ < (this->m_options).linelength;
          s_1.d.size._4_4_ = s_1.d.size._4_4_ + 1) {
        pQVar15 = this;
        QString::QString((QString *)local_2a0);
        local_2a1 = 0;
        pQVar1 = this->m_hexdocument;
        qVar12 = positionFromLineCol(this,local_28,(ulong)s_1.d.size._4_4_);
        uVar7 = QHexDocument::accept(pQVar1,(int)qVar12,__addr_00,(socklen_t *)pQVar15);
        if ((uVar7 & 1) == 0) {
          local_2b8._18_2_ = (this->m_options).invalidchar.ucs;
          QString::operator=((QString *)local_2a0,(QChar)local_2b8._18_2_);
        }
        else {
          bVar3 = QByteArray::isEmpty((QByteArray *)local_128);
          if ((bVar3) ||
             (uVar11 = (ulong)s_1.d.size._4_4_, qVar13 = QByteArray::size((QByteArray *)local_128),
             qVar13 <= (long)uVar11)) {
            QChar::QChar(&local_2a4,' ');
          }
          else {
            cVar5 = QByteArray::at((QByteArray *)local_128,(ulong)s_1.d.size._4_4_);
            uVar11 = QChar::isPrint((int)cVar5);
            if ((uVar11 & 1) == 0) {
              local_2a4.ucs = (this->m_options).unprintablechar.ucs;
            }
            else {
              cVar5 = QByteArray::at((QByteArray *)local_128,(ulong)s_1.d.size._4_4_);
              QChar::QChar(&local_2a4,cVar5);
            }
          }
          QString::operator=((QString *)local_2a0,local_2a4);
          lVar14 = (long)(int)s_1.d.size._4_4_;
          qVar13 = QByteArray::size((QByteArray *)local_128);
          if (lVar14 < qVar13) {
            local_2a1 = QByteArray::at((QByteArray *)local_128,(ulong)s_1.d.size._4_4_);
          }
          else {
            local_2a1 = 0;
          }
        }
        uVar7 = s_1.d.size._4_4_;
        bVar2 = local_2a1;
        QByteArray::size((QByteArray *)local_128);
        drawFormat((QHexView *)local_2b8,(QTextCursor *)this,(quint8)c,(QString *)(ulong)bVar2,
                   (QHexArea)local_2a0,3,local_28,SUB41(uVar7,0));
        QTextCharFormat::~QTextCharFormat((QTextCharFormat *)local_2b8);
        QString::~QString((QString *)local_2a0);
      }
      QTextBlockFormat::QTextBlockFormat(local_2c8);
      bVar3 = QColor::isValid(&(this->m_options).linealternatebackground);
      if ((bVar3) && ((local_28 & 1) != 0)) {
        QBrush::QBrush(local_2d0,(QColor *)&(this->m_options).linealternatebackground,SolidPattern);
        QTextFormat::setBackground((QTextFormat *)local_2c8,local_2d0);
        QBrush::~QBrush(local_2d0);
      }
      else {
        bVar3 = QColor::isValid(&(this->m_options).linebackground);
        if ((bVar3) && ((local_28 & 1) == 0)) {
          QBrush::QBrush(local_2d8,(QColor *)&(this->m_options).linebackground,SolidPattern);
          QTextFormat::setBackground((QTextFormat *)local_2c8,local_2d8);
          QBrush::~QBrush(local_2d8);
        }
      }
      QTextCursor::setBlockFormat((QTextBlockFormat *)c);
      QTextBlockFormat::QTextBlockFormat(local_2e8);
      QTextCursor::insertBlock((QTextBlockFormat *)c);
      QTextBlockFormat::~QTextBlockFormat(local_2e8);
      bVar3 = QHexDocument::isEmpty(this->m_hexdocument);
      QTextBlockFormat::~QTextBlockFormat(local_2c8);
      QByteArray::~QByteArray((QByteArray *)local_128);
      QTextCharFormat::~QTextCharFormat(local_c0);
      QString::~QString((QString *)local_78);
      if (bVar3) break;
      address = address + 1;
      local_28 = local_28 + 1;
      lineHeight(this);
    }
    QTextCharFormat::~QTextCharFormat(local_38);
  }
  return;
}

Assistant:

void QHexView::drawDocument(QTextCursor& c) const {
    if(!m_hexdocument)
        return;

    qreal y = !m_options.hasFlag(QHexFlags::NoHeader) ? this->lineHeight() : 0;
    quint64 line = static_cast<quint64>(this->verticalScrollBar()->value());

    QTextCharFormat addrformat;
    addrformat.setForeground(
        this->palette().color(QPalette::Normal, QPalette::Highlight));

    for(qint64 l = 0; m_hexdocument->isEmpty() ||
                      (line < this->lines() && l < this->visibleLines());
        l++, line++, y += this->lineHeight()) {
        quint64 address = line * m_options.linelength + this->baseAddress();
        QString addrstr = QString::number(address, 16)
                              .rightJustified(this->addressWidth(), '0')
                              .toUpper();

        // Address Part
        QTextCharFormat acf;
        acf.setForeground(m_options.headercolor);

        if(m_options.hasFlag(QHexFlags::StyledAddress))
            acf.setBackground(this->palette().color(QPalette::Window));

        if(m_hexdelegate)
            m_hexdelegate->renderAddress(address, acf, this);

        if(m_hexcursor->line() == static_cast<qint64>(line) &&
           m_options.hasFlag(QHexFlags::HighlightAddress)) {
            acf.setBackground(this->palette().color(QPalette::Highlight));
            acf.setForeground(this->palette().color(QPalette::HighlightedText));
        }

        c.insertText(" " + addrstr + " ", acf);

        QByteArray linebytes = this->getLine(line);
        c.insertText(" ", {});

        // Hex Part
        for(unsigned int column = 0u; column < m_options.linelength;) {
            QTextCharFormat cf;

            for(unsigned int byteidx = 0u; byteidx < m_options.grouplength;
                byteidx++, column++) {
                QString s;
                quint8 b{};

                if(m_hexdocument->accept(
                       this->positionFromLineCol(line, column))) {
                    s = linebytes.isEmpty() ||
                                column >= static_cast<qint64>(linebytes.size())
                            ? "  "
                            : QString(QHexUtils::toHex(linebytes.mid(column, 1))
                                          .toUpper());
                    b = static_cast<int>(column) < linebytes.size()
                            ? linebytes.at(column)
                            : 0x00;
                }
                else
                    s = QString(m_options.invalidchar).repeated(2);

                cf = this->drawFormat(c, b, s, QHexArea::Hex, line, column,
                                      static_cast<int>(column) <
                                          linebytes.size());
            }

            c.insertText(" ", cf);
        }

        c.insertText(" ", {});

        // Ascii Part
        for(unsigned int column = 0u; column < m_options.linelength; column++) {
            QString s;
            quint8 b{};

            if(m_hexdocument->accept(this->positionFromLineCol(line, column))) {
                s = linebytes.isEmpty() ||
                            column >= static_cast<qint64>(linebytes.size())
                        ? QChar(' ')
                        : (QChar::isPrint(linebytes.at(column))
                               ? QChar(linebytes.at(column))
                               : m_options.unprintablechar);

                b = static_cast<int>(column) < linebytes.size()
                        ? linebytes.at(column)
                        : 0x00;
            }
            else
                s = m_options.invalidchar;

            this->drawFormat(c, b, s, QHexArea::Ascii, line, column,
                             static_cast<int>(column) < linebytes.size());
        }

        QTextBlockFormat bf;

        if(m_options.linealternatebackground.isValid() && line % 2)
            bf.setBackground(m_options.linealternatebackground);
        else if(m_options.linebackground.isValid() && !(line % 2))
            bf.setBackground(m_options.linebackground);

        c.setBlockFormat(bf);
        c.insertBlock({});
        if(m_hexdocument->isEmpty())
            break;
    }
}